

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

int __thiscall Mpp::poll(Mpp *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  MppPort local_30;
  MppTaskQueue port;
  MPP_RET ret;
  MppPollType timeout_local;
  MppPortType type_local;
  Mpp *this_local;
  
  if (this->mInitDone == 0) {
    this_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    port._4_4_ = MPP_NOK;
    local_30 = (MppPort)0x0;
    set_io_mode(this,MPP_IO_MODE_TASK);
    if ((int)__fds == 0) {
      local_30 = this->mUsrInPort;
    }
    else if ((int)__fds == 1) {
      local_30 = this->mUsrOutPort;
    }
    if (local_30 != (MppPort)0x0) {
      port._4_4_ = _mpp_port_poll("poll",local_30,(MppPollType)__nfds);
    }
    this_local._4_4_ = port._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::poll(MppPortType type, MppPollType timeout)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
    } break;
    default : {
    } break;
    }

    if (port)
        ret = mpp_port_poll(port, timeout);

    return ret;
}